

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::insertAction(QWidget *this,QAction *before,QAction *action)

{
  long lVar1;
  ulong uVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  QAction *pQVar8;
  QPodArrayOps<QObject*> *this_00;
  long in_FS_OFFSET;
  QWidget *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (action == (QAction *)0x0) {
    insertAction();
    goto LAB_002fe6e3;
  }
  lVar4 = *(long *)&this->field_0x8;
  lVar5 = *(long *)(lVar4 + 0x230);
  if (lVar5 == 0) {
LAB_002fe65b:
    lVar5 = 0;
    pQVar8 = (QAction *)0x0;
  }
  else {
    lVar6 = 0;
    do {
      if (lVar5 * 8 - lVar6 == 0) goto LAB_002fe608;
      lVar1 = lVar6 + 8;
      plVar3 = (long *)(*(long *)(lVar4 + 0x228) + lVar6);
      lVar6 = lVar1;
    } while ((QAction *)*plVar3 != action);
    if (lVar1 != 0) {
      removeAction(this,action);
      lVar5 = *(long *)(lVar4 + 0x230);
    }
LAB_002fe608:
    if (lVar5 == 0) goto LAB_002fe65b;
    uVar7 = 0xfffffffffffffff8;
    do {
      pQVar8 = (QAction *)0x0;
      if (lVar5 * -8 + uVar7 == -8) goto LAB_002fe660;
      uVar2 = uVar7 + 8;
      plVar3 = (long *)(*(long *)(lVar4 + 0x228) + 8 + uVar7);
      uVar7 = uVar2;
    } while ((QAction *)*plVar3 != before);
    pQVar8 = (QAction *)0x0;
    if ((uVar2 >> 0x22 & 1) == 0) {
      lVar5 = (long)uVar2 >> 3;
      pQVar8 = before;
    }
  }
LAB_002fe660:
  local_58 = (QWidget *)action;
  QtPrivate::QPodArrayOps<QAction*>::emplace<QAction*&>
            ((QPodArrayOps<QAction*> *)(lVar4 + 0x220),(long)(int)lVar5,(QAction **)&local_58);
  QList<QAction_*>::begin((QList<QAction_*> *)(lVar4 + 0x220));
  this_00 = (QPodArrayOps<QObject*> *)(*(long *)(action + 8) + 0x140);
  local_58 = this;
  QtPrivate::QPodArrayOps<QObject*>::emplace<QObject*&>
            (this_00,*(qsizetype *)(*(long *)(action + 8) + 0x150),(QObject **)&local_58);
  QList<QObject_*>::end((QList<QObject_*> *)this_00);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QActionEvent::QActionEvent((QActionEvent *)&local_58,0x72,action,pQVar8);
  QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_58);
  QActionEvent::~QActionEvent((QActionEvent *)&local_58);
LAB_002fe6e3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::insertAction(QAction *before, QAction *action)
{
    if (Q_UNLIKELY(!action)) {
        qWarning("QWidget::insertAction: Attempt to insert null action");
        return;
    }

    Q_D(QWidget);
    if (d->actions.contains(action))
        removeAction(action);

    int pos = d->actions.indexOf(before);
    if (pos < 0) {
        before = nullptr;
        pos = d->actions.size();
    }
    d->actions.insert(pos, action);

    QActionPrivate *apriv = action->d_func();
    apriv->associatedObjects.append(this);

    QActionEvent e(QEvent::ActionAdded, action, before);
    QCoreApplication::sendEvent(this, &e);
}